

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

void TestConstExpr::ComparisonTestT<unsigned_int>(void)

{
  ComparisonTestTU<unsigned_int,char>();
  ComparisonTestTU<unsigned_int,signed_char>();
  ComparisonTestTU<unsigned_int,unsigned_char>();
  ComparisonTestTU<unsigned_int,short>();
  ComparisonTestTU<unsigned_int,unsigned_short>();
  ComparisonTestTU<unsigned_int,int>();
  ComparisonTestTU<unsigned_int,unsigned_int>();
  ComparisonTestTU<unsigned_int,long>();
  ComparisonTestTU<unsigned_int,unsigned_long>();
  ComparisonTestTU<unsigned_int,long_long>();
  ComparisonTestTU<unsigned_int,unsigned_long_long>();
  return;
}

Assistant:

void ComparisonTestT()
	{
		ComparisonTestTU<T, char>();
		ComparisonTestTU<T, signed char>();
		ComparisonTestTU<T, unsigned char>();
		ComparisonTestTU<T, signed short>();
		ComparisonTestTU<T, unsigned short>();
		ComparisonTestTU<T, signed int>();
		ComparisonTestTU<T, unsigned int>();
		ComparisonTestTU<T, signed long>();
		ComparisonTestTU<T, unsigned long>();
		ComparisonTestTU<T, signed long long>();
		ComparisonTestTU<T, unsigned long long>();
	}